

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Crc32.cpp
# Opt level: O3

uint32_t crc32_4bytes(void *data,size_t length,uint32_t previousCrc32)

{
  uint uVar1;
  size_t sVar2;
  
  uVar1 = ~previousCrc32;
  if (3 < length) {
    do {
      uVar1 = uVar1 ^ *data;
      uVar1 = *(uint *)((long)Crc32Lookup[1] + (ulong)(uVar1 >> 0xe & 0x3fc)) ^
              Crc32Lookup[0][uVar1 >> 0x18] ^ Crc32Lookup[2][uVar1 >> 8 & 0xff] ^
              Crc32Lookup[3][uVar1 & 0xff];
      data = (void *)((long)data + 4);
      length = length - 4;
    } while (3 < length);
  }
  if (length != 0) {
    sVar2 = 0;
    do {
      uVar1 = uVar1 >> 8 ^ Crc32Lookup[0][(uint)*(byte *)((long)data + sVar2) ^ uVar1 & 0xff];
      sVar2 = sVar2 + 1;
    } while (length != sVar2);
  }
  return ~uVar1;
}

Assistant:

uint32_t crc32_4bytes(const void* data, size_t length, uint32_t previousCrc32 = 0)
{
  uint32_t  crc = ~previousCrc32; // same as previousCrc32 ^ 0xFFFFFFFF
  const uint32_t* current = (const uint32_t*) data;

  // process four bytes at once (Slicing-by-4)
  while (length >= 4)
  {
#if __BYTE_ORDER == __BIG_ENDIAN
    uint32_t one = *current++ ^ swap(crc);
    crc = Crc32Lookup[0][ one      & 0xFF] ^
          Crc32Lookup[1][(one>> 8) & 0xFF] ^
          Crc32Lookup[2][(one>>16) & 0xFF] ^
          Crc32Lookup[3][(one>>24) & 0xFF];
#else
    uint32_t one = *current++ ^ crc;
    crc = Crc32Lookup[0][(one>>24) & 0xFF] ^
          Crc32Lookup[1][(one>>16) & 0xFF] ^
          Crc32Lookup[2][(one>> 8) & 0xFF] ^
          Crc32Lookup[3][ one      & 0xFF];
#endif

    length -= 4;
  }

  const uint8_t* currentChar = (const uint8_t*) current;
  // remaining 1 to 3 bytes (standard algorithm)
  while (length-- != 0)
    crc = (crc >> 8) ^ Crc32Lookup[0][(crc & 0xFF) ^ *currentChar++];

  return ~crc; // same as crc ^ 0xFFFFFFFF
}